

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

Token * __thiscall TokenStream::lookahead(Token *__return_storage_ptr__,TokenStream *this)

{
  undefined8 uVar1;
  unsigned_long_long uVar2;
  _Any_data *p_Var3;
  
  if ((this->stash).super__Optional_base<Token,_true,_true>._M_payload.
      super__Optional_payload_base<Token>._M_engaged == true) {
    uVar1 = *(undefined8 *)
             ((long)&(this->stash).super__Optional_base<Token,_true,_true>._M_payload.
                     super__Optional_payload_base<Token>._M_payload + 0x10);
    __return_storage_ptr__->type = (int)uVar1;
    __return_storage_ptr__->value = (char)((ulong)uVar1 >> 0x20);
    *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
    uVar2 = (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
            super__Optional_payload_base<Token>._M_payload._M_value.span.end;
    (__return_storage_ptr__->span).begin =
         (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
         super__Optional_payload_base<Token>._M_payload._M_value.span.begin;
    (__return_storage_ptr__->span).end = uVar2;
  }
  else {
    if ((this->supplier).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      if (*(char *)((long)this + 0x38) == '\0') {
        if (*(long *)((long)this + 0x10) == 0) {
          std::__throw_bad_function_call();
          (__return_storage_ptr__->span).begin = 0;
          (__return_storage_ptr__->span).end = 0;
          __return_storage_ptr__->type = Dot;
          __return_storage_ptr__->value = '\0';
          *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
          p_Var3 = *(_Any_data **)((long)this + 0x18);
          __return_storage_ptr__[1].span.begin = (unsigned_long_long)p_Var3;
          if (*(long *)((long)this + 0x10) != 0) {
            p_Var3 = (_Any_data *)((long)this + 0x10);
            uVar2 = *(unsigned_long_long *)((long)this + 8);
            (__return_storage_ptr__->span).begin = *(unsigned_long_long *)this;
            (__return_storage_ptr__->span).end = uVar2;
            uVar1 = *(undefined8 *)((long)this + 0x10);
            __return_storage_ptr__->type = (int)uVar1;
            __return_storage_ptr__->value = (char)((ulong)uVar1 >> 0x20);
            *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
            *(undefined8 *)p_Var3 = 0;
            *(undefined8 *)((long)this + 0x18) = 0;
          }
          *(undefined1 *)&__return_storage_ptr__[2].span.end = 0;
          return (Token *)p_Var3;
        }
        (**(code **)((long)this + 0x18))(__return_storage_ptr__,(_Any_data *)this);
      }
      else {
        uVar1 = *(undefined8 *)((long)this + 0x30);
        __return_storage_ptr__->type = (int)uVar1;
        __return_storage_ptr__->value = (char)((ulong)uVar1 >> 0x20);
        *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
        uVar2 = *(unsigned_long_long *)((long)this + 0x28);
        (__return_storage_ptr__->span).begin = *(unsigned_long_long *)((long)this + 0x20);
        (__return_storage_ptr__->span).end = uVar2;
        *(undefined1 *)((long)this + 0x38) = 0;
      }
      return __return_storage_ptr__;
    }
    (*(this->supplier)._M_invoker)(__return_storage_ptr__,(_Any_data *)this);
    if ((this->stash).super__Optional_base<Token,_true,_true>._M_payload.
        super__Optional_payload_base<Token>._M_engaged == true) {
      (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
      super__Optional_payload_base<Token>._M_engaged = false;
    }
    *(undefined8 *)
     ((long)&(this->stash).super__Optional_base<Token,_true,_true>._M_payload.
             super__Optional_payload_base<Token>._M_payload + 0x10) =
         *(undefined8 *)&__return_storage_ptr__->type;
    uVar2 = (__return_storage_ptr__->span).end;
    (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
    super__Optional_payload_base<Token>._M_payload._M_value.span.begin =
         (__return_storage_ptr__->span).begin;
    (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
    super__Optional_payload_base<Token>._M_payload._M_value.span.end = uVar2;
    (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
    super__Optional_payload_base<Token>._M_engaged = true;
  }
  return __return_storage_ptr__;
}

Assistant:

auto TokenStream::lookahead() -> Token {
    if (stash)
        return stash.value();

    auto token = supplier();
    stash.emplace(token);
    return token;
}